

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

char vrna_nucleotide_decode(int enc,vrna_md_t *md)

{
  vrna_md_t *md_local;
  int enc_local;
  
  if (md == (vrna_md_t *)0x0) {
    md_local._7_1_ = '\0';
  }
  else if (md->energy_set < 1) {
    md_local._7_1_ = "_ACGUTXKI"[enc];
  }
  else {
    md_local._7_1_ = (char)enc + '@';
  }
  return md_local._7_1_;
}

Assistant:

PUBLIC char
vrna_nucleotide_decode(int        enc,
                       vrna_md_t  *md)
{
  if (md) {
    if (md->energy_set > 0)
      return (char)enc + 'A' - 1;
    else
      return (char)Law_and_Order[enc];
  } else {
    return (char)0;
  }
}